

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O0

void makeIntColumns(Matrix<Complex> *m)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  Complex *pCVar4;
  row_t a;
  Matrix<Complex> *in_RDI;
  uint i_1;
  uint i;
  uint neg;
  uint pos;
  BigInteger g;
  uint col;
  Complex *in_stack_fffffffffffffbc8;
  Complex *in_stack_fffffffffffffbd0;
  row_t in_stack_fffffffffffffbd8;
  uint in_stack_fffffffffffffbe0;
  uint in_stack_fffffffffffffbe4;
  BigInteger *in_stack_fffffffffffffbf0;
  undefined7 in_stack_fffffffffffffbf8;
  undefined1 in_stack_fffffffffffffbff;
  row_t in_stack_fffffffffffffc08;
  undefined7 in_stack_fffffffffffffc10;
  undefined1 in_stack_fffffffffffffc17;
  bool local_389;
  MatrixRow<Complex_&> local_360 [3];
  Complex *in_stack_fffffffffffffcb8;
  Complex *in_stack_fffffffffffffcd8;
  Complex *in_stack_fffffffffffffce0;
  uint local_2d4;
  BigInteger local_2d0;
  Complex *in_stack_fffffffffffffd58;
  Complex *in_stack_fffffffffffffd60;
  MatrixRow<Complex_&> local_230 [17];
  MatrixRow<Complex_&> local_1a8;
  MatrixRow<Complex_&> local_1a0 [13];
  MatrixRow<Complex_&> local_138 [9];
  byte local_e9;
  byte local_c1;
  MatrixRow<Complex_&> local_c0 [9];
  MatrixRow<Complex_&> local_78 [7];
  uint local_3c;
  uint local_38;
  uint local_34;
  uint local_c;
  Matrix<Complex> *local_8;
  
  local_8 = in_RDI;
  for (local_c = 0; uVar1 = local_c, uVar3 = Matrix<Complex>::width(local_8), uVar1 < uVar3;
      local_c = local_c + 1) {
    BigInteger::BigInteger
              ((BigInteger *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
               (longlong)in_stack_fffffffffffffbd8.arr);
    local_34 = 0;
    local_38 = 0;
    for (local_3c = 0; uVar1 = local_3c, uVar3 = Matrix<Complex>::height(local_8), uVar1 < uVar3;
        local_3c = local_3c + 1) {
      local_c1 = 0;
      local_e9 = 0;
      local_78[0].arr = (Complex *)Matrix<Complex>::operator[](in_stack_fffffffffffffbc8,0);
      pCVar4 = Matrix<Complex>::MatrixRow<Complex_&>::operator[](local_78,local_c);
      Complex::re(pCVar4);
      Rational::denominator(&in_stack_fffffffffffffbc8->_re);
      BigInteger::BigInteger
                ((BigInteger *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                 (longlong)in_stack_fffffffffffffbd8.arr);
      bVar2 = operator!=((BigInteger *)in_stack_fffffffffffffbd0,
                         (BigInteger *)in_stack_fffffffffffffbc8);
      local_389 = true;
      if (!bVar2) {
        local_c0[0].arr = (Complex *)Matrix<Complex>::operator[](in_stack_fffffffffffffbc8,0);
        pCVar4 = Matrix<Complex>::MatrixRow<Complex_&>::operator[](local_c0,local_c);
        Complex::im(pCVar4);
        Rational::denominator(&in_stack_fffffffffffffbc8->_re);
        local_c1 = 1;
        BigInteger::BigInteger
                  ((BigInteger *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                   (longlong)in_stack_fffffffffffffbd8.arr);
        local_e9 = 1;
        local_389 = operator!=((BigInteger *)in_stack_fffffffffffffbd0,
                               (BigInteger *)in_stack_fffffffffffffbc8);
      }
      if ((local_e9 & 1) != 0) {
        BigInteger::~BigInteger((BigInteger *)0x1525b7);
      }
      if ((local_c1 & 1) != 0) {
        BigInteger::~BigInteger((BigInteger *)0x1525d0);
      }
      BigInteger::~BigInteger((BigInteger *)0x1525dd);
      BigInteger::~BigInteger((BigInteger *)0x1525ea);
      if (local_389 != false) {
        local_138[0].arr = (Complex *)Matrix<Complex>::operator[](in_stack_fffffffffffffbc8,0);
        Matrix<Complex>::MatrixRow<Complex_&>::operator[](local_138,local_c);
        Complex::denominator(in_stack_fffffffffffffcb8);
        BigInteger::BigInteger
                  ((BigInteger *)in_stack_fffffffffffffbd0,(BigInteger *)in_stack_fffffffffffffbc8);
        a = Matrix<Complex>::operator[](in_stack_fffffffffffffbc8,0);
        local_1a0[0].arr = a.arr;
        pCVar4 = Matrix<Complex>::MatrixRow<Complex_&>::operator[](local_1a0,local_c);
        Complex::denominator(in_stack_fffffffffffffcb8);
        gcd((BigInteger *)a.arr,(BigInteger *)pCVar4);
        operator/((BigInteger *)CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
                  in_stack_fffffffffffffbf0);
        BigInteger::operator*=
                  ((BigInteger *)CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10),
                   (BigInteger *)in_stack_fffffffffffffc08.arr);
        BigInteger::~BigInteger((BigInteger *)0x152725);
        BigInteger::~BigInteger((BigInteger *)0x152732);
        BigInteger::~BigInteger((BigInteger *)0x15273f);
        BigInteger::~BigInteger((BigInteger *)0x15274c);
        BigInteger::~BigInteger((BigInteger *)0x152759);
      }
      local_1a8.arr = (Complex *)Matrix<Complex>::operator[](in_stack_fffffffffffffbc8,0);
      Matrix<Complex>::MatrixRow<Complex_&>::operator[](&local_1a8,local_c);
      Complex::Complex((Complex *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                       (longlong)in_stack_fffffffffffffbd8.arr);
      in_stack_fffffffffffffc17 =
           Complex::operator>(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
      local_34 = local_34 + (byte)in_stack_fffffffffffffc17;
      Complex::~Complex(in_stack_fffffffffffffbd0);
      in_stack_fffffffffffffc08 = Matrix<Complex>::operator[](in_stack_fffffffffffffbc8,0);
      local_230[0].arr = in_stack_fffffffffffffc08.arr;
      Matrix<Complex>::MatrixRow<Complex_&>::operator[](local_230,local_c);
      Complex::Complex((Complex *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                       (longlong)in_stack_fffffffffffffbd8.arr);
      in_stack_fffffffffffffbff =
           Complex::operator<(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
      local_38 = (byte)in_stack_fffffffffffffbff + local_38;
      Complex::~Complex(in_stack_fffffffffffffbd0);
    }
    if (local_34 < local_38) {
      in_stack_fffffffffffffbf0 = &local_2d0;
      BigInteger::operator-((BigInteger *)in_stack_fffffffffffffbd8.arr);
      BigInteger::operator=
                ((BigInteger *)in_stack_fffffffffffffbd0,(BigInteger *)in_stack_fffffffffffffbc8);
      BigInteger::~BigInteger((BigInteger *)0x1529f9);
    }
    local_2d4 = 0;
    while (in_stack_fffffffffffffbe0 = local_2d4,
          in_stack_fffffffffffffbe4 = Matrix<Complex>::height(local_8),
          in_stack_fffffffffffffbe0 < in_stack_fffffffffffffbe4) {
      Complex::Complex((Complex *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                       (BigInteger *)in_stack_fffffffffffffbd8.arr);
      in_stack_fffffffffffffbd8 = Matrix<Complex>::operator[](in_stack_fffffffffffffbc8,0);
      local_360[0].arr = in_stack_fffffffffffffbd8.arr;
      in_stack_fffffffffffffbd0 =
           Matrix<Complex>::MatrixRow<Complex_&>::operator[](local_360,local_c);
      Complex::operator*=(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
      Complex::~Complex(in_stack_fffffffffffffbd0);
      local_2d4 = local_2d4 + 1;
    }
    BigInteger::~BigInteger((BigInteger *)0x152b1b);
  }
  return;
}

Assistant:

void makeIntColumns(Matrix<Complex> &m)
{
    for(unsigned col = 0; col < m.width(); ++col)
    {
        BigInteger g = 1;
        unsigned pos = 0, neg = 0;
        for(unsigned i = 0; i < m.height(); ++i)
        {
            if(m[i][col].re().denominator() != 1 || m[i][col].im().denominator() != 1)
            {
                g *= m[i][col].denominator() / gcd(g, m[i][col].denominator());
            }
            pos += m[i][col] > 0;
            neg += m[i][col] < 0;
        }
        if(neg > pos)
            g = -g;
        for(unsigned i = 0; i < m.height(); ++i)
        {
            m[i][col] *= g;
        }
    }
}